

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  Uint8 blue;
  byte bVar1;
  char *__s;
  VideoMode mode;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  FILE *pFVar2;
  byte bVar3;
  Int32 IVar4;
  optional<n_e_s::core::Pixel> oVar5;
  ImGuiIO *pIVar6;
  INesController *controller1;
  Pixel *pPVar7;
  string *text;
  bool bVar8;
  exception *e;
  char *local_59d8;
  undefined1 local_59d0 [16];
  Time frame_time;
  undefined1 local_59b6 [4];
  Color color;
  optional<n_e_s::core::Pixel> pixel;
  size_t i;
  size_t kTickPerFrame;
  size_t kNESClock;
  size_t kMasterClock;
  Int64 local_5988;
  size_t local_5980;
  Time delta_time;
  Clock delta_clock;
  long local_5958;
  ifstream fs;
  allocator<char> local_5739;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5738;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5718;
  undefined1 local_56f8 [8];
  SimpleRenderer simple_renderer;
  Gui gui;
  PpuHelper ppu_helper;
  Control control;
  Nes nes;
  Screen screen;
  ImGuiIO *io;
  int kFps;
  ContextSettings local_538;
  locale local_510 [8];
  String local_508;
  VideoMode local_4e4;
  undefined1 local_4d8 [8];
  RenderWindow window;
  char **argv_local;
  int argc_local;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char_*> **local_2b0;
  char *local_2a8;
  size_t local_2a0;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char_*> *local_298 [2];
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char_*> **local_288;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char_*> *vargs;
  char *local_278;
  size_t sStack_270;
  format_args local_268;
  char *local_258;
  size_t local_250;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char_*> *local_248 [3];
  value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *local_230;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char_*> *vargs_1;
  FILE *local_220;
  char *local_218;
  size_t sStack_210;
  format_args local_208;
  char *local_1f8;
  int *local_1f0;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_int,_int> local_1e8;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_int,_int> *local_1c8;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_int,_int> *vargs_2;
  v8 *local_1b8;
  FILE *local_1b0;
  char *local_1a8;
  int *piStack_1a0;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_const_char_*> *vargs_3;
  char **local_140;
  char *local_138;
  size_t sStack_130;
  char **local_120;
  char *local_118;
  size_t sStack_110;
  value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *local_100;
  format_args *local_f8;
  value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *local_f0;
  undefined8 local_e8;
  format_args *local_e0;
  value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *local_d8;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char_*> **local_d0;
  int *local_c8;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char_*> **local_c0;
  undefined8 local_b8;
  int *local_b0;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char_*> **local_a8;
  char **local_a0;
  char *local_98;
  int *piStack_90;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_int,_int> *local_80;
  format_args *local_78;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_int,_int> *local_70;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_int,_int> *local_68;
  undefined8 local_60;
  format_args *local_58;
  
  window.super_RenderTarget.m_id = (Uint64)argv;
  sf::VideoMode::VideoMode(&local_4e4,0x500,0x3c0,0x20);
  std::locale::locale(local_510);
  sf::String::String(&local_508,"n_e_s visulization",local_510);
  sf::ContextSettings::ContextSettings(&local_538,0,0,0,1,1,0,false);
  mode.bitsPerPixel = local_4e4.bitsPerPixel;
  mode.width = local_4e4.width;
  mode.height = local_4e4.height;
  sf::RenderWindow::RenderWindow((RenderWindow *)local_4d8,mode,&local_508,7,&local_538);
  sf::String::~String(&local_508);
  std::locale::~locale(local_510);
  sf::Window::setFramerateLimit((Window *)local_4d8,0x14);
  ImGui::SFML::Init((RenderWindow *)local_4d8,true);
  pIVar6 = ImGui::GetIO();
  pIVar6->ConfigFlags = pIVar6->ConfigFlags | 0x40;
  pIVar6->ConfigDockingNoSplit = true;
  nesvis::Screen::Screen((Screen *)&nes.cycle_,0x100,0xf0,3.0);
  n_e_s::nes::Nes::Nes((Nes *)&control.nes_);
  nesvis::Control::Control((Control *)&ppu_helper,(Nes *)&control.nes_);
  nesvis::PpuHelper::PpuHelper((PpuHelper *)&gui.first_,(Nes *)&control.nes_);
  nesvis::Gui::Gui((Gui *)&simple_renderer.ppu_helper_,(Nes *)&control.nes_,(PpuHelper *)&gui.first_
                   ,(Control *)&ppu_helper);
  nesvis::SimpleRenderer::SimpleRenderer
            ((SimpleRenderer *)local_56f8,(Nes *)&control.nes_,(PpuHelper *)&gui.first_);
  if (1 < argc) {
    __s = *(char **)(window.super_RenderTarget.m_id + 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5738,__s,&local_5739);
    std::operator+(&local_5718,"Loading rom from: ",&local_5738);
    text = &local_5718;
    nesvis::LogWidget::add((LogWidget *)&simple_renderer.ppu_helper_,text);
    std::__cxx11::string::~string((string *)&local_5718);
    std::__cxx11::string::~string((string *)&local_5738);
    std::allocator<char>::~allocator(&local_5739);
    vargs = (format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char_*> *)
            (window.super_RenderTarget.m_id + 8);
    local_278 = "Loading rom from: {}\n";
    sStack_270 = 0x15;
    local_298[0] = fmt::v8::
                   make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,char*&>
                             (vargs,(v8 *)text,(char **)"Loading rom from: {}\n");
    local_288 = local_298;
    local_120 = &local_278;
    local_2a8 = local_278;
    local_2a0 = sStack_270;
    local_c8 = &argc_local;
    local_b8 = 0xc;
    _argc_local = 0xc;
    local_2b0 = local_288;
    format_str.size_ = sStack_270;
    format_str.data_ = local_278;
    local_118 = local_2a8;
    sStack_110 = local_2a0;
    local_d0 = local_288;
    local_c0 = local_288;
    local_b0 = local_c8;
    local_a8 = local_288;
    fmt::v8::vprint(format_str,_argc_local);
    std::ifstream::ifstream(&local_5958,*(char **)(window.super_RenderTarget.m_id + 8),_S_bin);
    bVar3 = std::ios::operator!((ios *)((long)&local_5958 + *(long *)(local_5958 + -0x18)));
    bVar8 = (bVar3 & 1) != 0;
    if (bVar8) {
      vargs_1 = (format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char_*> *)
                (window.super_RenderTarget.m_id + 8);
      local_218 = "Could not load file: {}\n";
      sStack_210 = 0x18;
      local_220 = _stderr;
      local_248[0] = fmt::v8::
                     make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,char*&>
                               (vargs_1,(v8 *)"Could not load file: {}\n",(char **)0x18);
      local_230 = (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)local_248;
      local_140 = &local_218;
      local_258 = local_218;
      local_250 = sStack_210;
      local_f8 = &local_268;
      local_e8 = 0xc;
      local_268.desc_ = 0xc;
      local_268.field_1.values_ = local_230;
      format_str_00.size_ = sStack_210;
      format_str_00.data_ = local_218;
      local_138 = local_258;
      sStack_130 = local_250;
      local_100 = local_230;
      local_f0 = local_230;
      local_e0 = local_f8;
      local_d8 = local_230;
      fmt::v8::vprint(local_220,format_str_00,local_268);
    }
    else {
      n_e_s::nes::Nes::load_rom((Nes *)&control.nes_,(istream *)&local_5958);
    }
    argv_local._4_4_ = (uint)bVar8;
    std::ifstream::~ifstream(&local_5958);
    if (bVar8) goto LAB_00115d51;
  }
  nesvis::PpuWidget::load_pattern_tables((PpuWidget *)&gui.cpu_widget.control_);
  sf::Clock::Clock((Clock *)&delta_time);
  while (bVar8 = sf::Window::isOpen((Window *)local_4d8), bVar8) {
    anon_unknown.dwarf_83d0::poll_events((RenderWindow *)local_4d8);
    local_5988 = (Int64)sf::Clock::restart((Clock *)&delta_time);
    local_5980 = local_5988;
    ImGui::SFML::Update((RenderWindow *)local_4d8,(Time)local_5988);
    controller1 = n_e_s::nes::Nes::controller1((Nes *)&control.nes_);
    anon_unknown.dwarf_83d0::handle_keys(controller1);
    sf::Color::Color((Color *)((long)&kMasterClock + 4),'\0','\0','\0',0xff);
    sf::RenderTarget::clear
              ((RenderTarget *)&window.super_Window.m_size,(Color *)((long)&kMasterClock + 4));
    bVar8 = nesvis::Control::is_running((Control *)&ppu_helper);
    if (bVar8) {
      for (stack0xffffffffffffa650 = (char *)0x0; stack0xffffffffffffa650 < "_3.4.21";
          register0x00000000 = stack0xffffffffffffa650 + 1) {
        oVar5 = n_e_s::nes::Nes::execute((Nes *)&control.nes_);
        local_59b6 = oVar5.super__Optional_base<n_e_s::core::Pixel,_true,_true>._M_payload.
                     super__Optional_payload_base<n_e_s::core::Pixel>._M_payload._0_4_;
        color._0_2_ = oVar5.super__Optional_base<n_e_s::core::Pixel,_true,_true>._M_payload.
                      super__Optional_payload_base<n_e_s::core::Pixel>._4_2_;
        bVar8 = std::optional::operator_cast_to_bool((optional *)local_59b6);
        if ((bVar8) &&
           (bVar8 = nesvis::Control::use_simple_renderer((Control *)&ppu_helper), !bVar8)) {
          pPVar7 = std::optional<n_e_s::core::Pixel>::operator->
                             ((optional<n_e_s::core::Pixel> *)local_59b6);
          blue = (pPVar7->color).b;
          frame_time.m_microseconds._6_1_ = (pPVar7->color).r;
          frame_time.m_microseconds._7_1_ = (pPVar7->color).g;
          pPVar7 = std::optional<n_e_s::core::Pixel>::operator->
                             ((optional<n_e_s::core::Pixel> *)local_59b6);
          bVar3 = pPVar7->x;
          pPVar7 = std::optional<n_e_s::core::Pixel>::operator->
                             ((optional<n_e_s::core::Pixel> *)local_59b6);
          bVar1 = pPVar7->y;
          sf::Color::Color((Color *)((long)&frame_time.m_microseconds + 2),
                           frame_time.m_microseconds._6_1_,frame_time.m_microseconds._7_1_,blue,0xff
                          );
          nesvis::Screen::set_pixel
                    ((Screen *)&nes.cycle_,(uint)bVar3,(uint)bVar1,
                     (Color *)((long)&frame_time.m_microseconds + 2));
        }
      }
    }
    bVar8 = nesvis::Control::use_simple_renderer((Control *)&ppu_helper);
    if (bVar8) {
      nesvis::SimpleRenderer::render((SimpleRenderer *)local_56f8,(Screen *)&nes.cycle_);
    }
    nesvis::Gui::draw((Gui *)&simple_renderer.ppu_helper_);
    nesvis::Screen::draw((Screen *)&nes.cycle_,(RenderWindow *)local_4d8);
    ImGui::SFML::Render((RenderWindow *)local_4d8);
    sf::Window::display((Window *)local_4d8);
    local_59d0._8_8_ = local_5980;
    IVar4 = sf::Time::asMilliseconds((Time *)(local_59d0 + 8));
    pFVar2 = _stderr;
    if (0x32 < IVar4) {
      local_59d8 = "Things are running slowly: {}ms - {}ms\n";
      local_59d0._0_8_ = (int *)0x27;
      e._4_4_ = sf::Time::asMilliseconds((Time *)(local_59d0 + 8));
      e._0_4_ = 0x32;
      local_1a8 = local_59d8;
      piStack_1a0 = (int *)local_59d0._0_8_;
      local_1b0 = pFVar2;
      local_1b8 = (v8 *)((long)&e + 4);
      vargs_2 = (format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_int,_int>
                 *)&e;
      fmt::v8::make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,int&,int&>
                (&local_1e8,local_1b8,(int *)vargs_2,(int *)local_59d0._0_8_);
      local_1c8 = &local_1e8;
      local_a0 = &local_1a8;
      local_1f8 = local_1a8;
      local_1f0 = piStack_1a0;
      local_78 = &local_208;
      local_60 = 0x11;
      local_208.desc_ = 0x11;
      local_208.field_1.values_ =
           (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)local_1c8;
      format_str_01.size_ = (size_t)piStack_1a0;
      format_str_01.data_ = local_1a8;
      local_98 = local_1f8;
      piStack_90 = local_1f0;
      local_80 = local_1c8;
      local_70 = local_1c8;
      local_68 = local_1c8;
      local_58 = local_78;
      fmt::v8::vprint(local_1b0,format_str_01,local_208);
    }
  }
  ImGui::SFML::Shutdown();
  argv_local._4_4_ = 0;
LAB_00115d51:
  nesvis::Gui::~Gui((Gui *)&simple_renderer.ppu_helper_);
  n_e_s::nes::Nes::~Nes((Nes *)&control.nes_);
  nesvis::Screen::~Screen((Screen *)&nes.cycle_);
  sf::RenderWindow::~RenderWindow((RenderWindow *)local_4d8);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
    sf::RenderWindow window(
            sf::VideoMode(kWinWidth, kWinHeight), "n_e_s visulization");
    constexpr int kFps = 20;
    window.setFramerateLimit(kFps);

    ImGui::SFML::Init(window);
    ImGuiIO &io = ImGui::GetIO();
    // NOLINTNEXTLINE(hicpp-signed-bitwise)
    io.ConfigFlags |= ImGuiConfigFlags_DockingEnable;
    io.ConfigDockingNoSplit = true;

    nesvis::Screen screen(kNesWidth, kNesHeight, kNesScaleFactor);
    n_e_s::nes::Nes nes;
    nesvis::Control control(&nes);
    nesvis::PpuHelper ppu_helper(&nes);
    nesvis::Gui gui(&nes, &ppu_helper, &control);

    nesvis::SimpleRenderer simple_renderer(&nes, &ppu_helper);

    try {
        if (argc > 1) {
            gui.log_widget.add("Loading rom from: " + std::string(argv[1]));
            fmt::print("Loading rom from: {}\n", argv[1]);
            std::ifstream fs(argv[1], std::ios::binary);
            if (!fs) {
                fmt::print(stderr, "Could not load file: {}\n", argv[1]);
                return 1;
            }
            nes.load_rom(fs);
        }

        gui.ppu_widget.load_pattern_tables();

        sf::Clock delta_clock;
        while (window.isOpen()) {
            poll_events(window);

            const sf::Time delta_time = delta_clock.restart();
            ImGui::SFML::Update(window, delta_time);

            handle_keys(nes.controller1());

            window.clear();

            // robinlinden/desunes
            constexpr size_t kMasterClock = 21'477'272; // Hz
            // Tick rates:
            // CPU: every 12 master ticks
            // PPU: every 4
            // APU: every 24
            constexpr size_t kNESClock = kMasterClock;
            constexpr size_t kTickPerFrame = kNESClock / kFps;
            if (control.is_running()) {
                for (size_t i = 0; i < kTickPerFrame; ++i) {
                    const auto pixel = nes.execute();
                    if (pixel && !control.use_simple_renderer()) {
                        const auto color = pixel->color;
                        screen.set_pixel(pixel->x,
                                pixel->y,
                                sf::Color(color.r, color.g, color.b));
                    }
                }
            }

            if (control.use_simple_renderer()) {
                simple_renderer.render(&screen);
            }

            gui.draw();
            screen.draw(window);

            ImGui::SFML::Render(window);
            window.display();

            const auto frame_time = delta_time;
            if (frame_time.asMilliseconds() > 1000 / kFps) {
                fmt::print(stderr,
                        "Things are running slowly: {}ms - {}ms\n",
                        frame_time.asMilliseconds(),
                        1000 / kFps);
            }
        }

        ImGui::SFML::Shutdown();
    } catch (const std::exception &e) {
        fmt::print(stderr, "Caught exception: {}\n", e.what());
    }

    return 0;
}